

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dp.c
# Opt level: O2

void MpiDisconnectWriterPerReader(CP_Services Svcs,DP_WSR_Stream WSR_Stream_v)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = *WSR_Stream_v;
  uVar3 = 0;
  (*Svcs->verbose)((void *)**(undefined8 **)((long)WSR_Stream_v + 0x18),5,
                   "MpiDisconnectWriterPerReader invoked [rank:%d;cohortSize:%d]\n",(ulong)uVar1,
                   (ulong)*(uint *)(*(undefined8 **)((long)WSR_Stream_v + 0x18) + 1));
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 * 8 != uVar3; uVar3 = uVar3 + 8) {
    if (*(undefined **)(*(long *)((long)WSR_Stream_v + 0x78) + uVar3) != &ompi_mpi_comm_null) {
      MPI_Comm_disconnect(*(long *)((long)WSR_Stream_v + 0x78) + uVar3);
    }
  }
  return;
}

Assistant:

static void MpiDisconnectWriterPerReader(CP_Services Svcs, DP_WSR_Stream WSR_Stream_v)
{
    MpiStreamWPR StreamWPR = (MpiStreamWPR)WSR_Stream_v;
    MpiStreamWR StreamWR = StreamWPR->StreamWR;

    const int CohortSize = StreamWPR->Link.CohortSize;

    Svcs->verbose(StreamWR->Stream.CP_Stream, DPTraceVerbose,
                  "MpiDisconnectWriterPerReader invoked [rank:%d;cohortSize:%d]\n", CohortSize,
                  StreamWR->Stream.Rank);

    for (int i = 0; i < CohortSize; i++)
    {
        if (StreamWPR->CohortMpiComms[i] != MPI_COMM_NULL)
        {
            MPI_Comm_disconnect(&StreamWPR->CohortMpiComms[i]);
        }
    }
}